

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O1

function<void_(UdpSocket_*,_void_*)> * __thiscall
SslUdpSocketImpl::BindFuncSslInitDone
          (function<void_(UdpSocket_*,_void_*)> *__return_storage_ptr__,SslUdpSocketImpl *this,
          function<void_(UdpSocket_*,_void_*)> *fSllInitDone)

{
  _Manager_type p_Var1;
  _Invoker_type p_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  _Any_data __tmp;
  
  uVar3 = *(undefined8 *)&(this->m_fSllInitDoneParam).super__Function_base._M_functor;
  uVar4 = *(undefined8 *)((long)&(this->m_fSllInitDoneParam).super__Function_base._M_functor + 8);
  uVar5 = *(undefined8 *)((long)&(fSllInitDone->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(this->m_fSllInitDoneParam).super__Function_base._M_functor =
       *(undefined8 *)&(fSllInitDone->super__Function_base)._M_functor;
  *(undefined8 *)((long)&(this->m_fSllInitDoneParam).super__Function_base._M_functor + 8) = uVar5;
  *(undefined8 *)&(fSllInitDone->super__Function_base)._M_functor = uVar3;
  *(undefined8 *)((long)&(fSllInitDone->super__Function_base)._M_functor + 8) = uVar4;
  p_Var1 = (this->m_fSllInitDoneParam).super__Function_base._M_manager;
  (this->m_fSllInitDoneParam).super__Function_base._M_manager =
       (fSllInitDone->super__Function_base)._M_manager;
  (fSllInitDone->super__Function_base)._M_manager = p_Var1;
  p_Var2 = (this->m_fSllInitDoneParam)._M_invoker;
  (this->m_fSllInitDoneParam)._M_invoker = fSllInitDone->_M_invoker;
  fSllInitDone->_M_invoker = p_Var2;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = p_Var2;
  p_Var1 = (fSllInitDone->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    uVar3 = *(undefined8 *)((long)&(fSllInitDone->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor =
         *(undefined8 *)&(fSllInitDone->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = uVar3;
    (__return_storage_ptr__->super__Function_base)._M_manager = p_Var1;
    (fSllInitDone->super__Function_base)._M_manager = (_Manager_type)0x0;
    fSllInitDone->_M_invoker = (_Invoker_type)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

function<void(UdpSocket*, void*)> SslUdpSocketImpl::BindFuncSslInitDone(function<void(UdpSocket*, void*)> fSllInitDone) noexcept
{
    m_fSllInitDoneParam.swap(fSllInitDone);
    return fSllInitDone;
}